

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecs.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FastPForLib::IntegerCODEC::compress
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          IntegerCODEC *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *data)

{
  pointer puVar1;
  size_t memavailable;
  allocator_type local_21;
  size_type local_20;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             ((long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 1) + 0x400,&local_21);
  local_20 = (long)(__return_storage_ptr__->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  puVar1 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (**this->_vptr_IntegerCODEC)
            (this,puVar1,
             (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(__return_storage_ptr__,local_20);
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint32_t> compress(const std::vector<uint32_t> &data) {
    std::vector<uint32_t> compresseddata(data.size() * 2 +
                                         1024); // allocate plenty of memory
    size_t memavailable = compresseddata.size();
    encodeArray(&data[0], data.size(), &compresseddata[0], memavailable);
    compresseddata.resize(memavailable);
    return compresseddata;
  }